

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O3

bool __thiscall CMU462::DynamicScene::Scene::removeObject(Scene *this,SceneObject *o)

{
  _Base_ptr p_Var1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  pair<std::_Rb_tree_iterator<CMU462::DynamicScene::SceneObject_*>,_std::_Rb_tree_iterator<CMU462::DynamicScene::SceneObject_*>_>
  pVar4;
  SceneObject *local_10;
  
  p_Var1 = (this->objects)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var1 != (_Base_ptr)0x0) {
    p_Var3 = &(this->objects)._M_t._M_impl.super__Rb_tree_header;
    p_Var2 = &p_Var3->_M_header;
    do {
      if (*(SceneObject **)(p_Var1 + 1) >= o) {
        p_Var2 = p_Var1;
      }
      p_Var1 = (&p_Var1->_M_left)[*(SceneObject **)(p_Var1 + 1) < o];
    } while (p_Var1 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 != p_Var3) && (*(SceneObject **)(p_Var2 + 1) <= o)) {
      local_10 = o;
      pVar4 = std::
              _Rb_tree<CMU462::DynamicScene::SceneObject_*,_CMU462::DynamicScene::SceneObject_*,_std::_Identity<CMU462::DynamicScene::SceneObject_*>,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
              ::equal_range(&(this->objects)._M_t,&local_10);
      std::
      _Rb_tree<CMU462::DynamicScene::SceneObject_*,_CMU462::DynamicScene::SceneObject_*,_std::_Identity<CMU462::DynamicScene::SceneObject_*>,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
      ::_M_erase_aux(&(this->objects)._M_t,(_Base_ptr)pVar4.first._M_node,
                     (_Base_ptr)pVar4.second._M_node);
      return true;
    }
  }
  return false;
}

Assistant:

bool Scene::removeObject( SceneObject* o )
{
   auto i = objects.find( o );
   if( i == objects.end() )
   {
      return false;
   }

   objects.erase( o );
   return true;
}